

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

node_ptr __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::get_child(basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            *this,node_type type,uint8_t child_index)

{
  uint8_t child_index_local;
  node_type type_local;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  if (type != LEAF) {
    switch(type) {
    case I4:
      this_local = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    *)basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::get_child((basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)this,child_index);
      break;
    case I16:
      this_local = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    *)basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::get_child((basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)this,child_index);
      break;
    case I48:
      this_local = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    *)basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::get_child((basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)this,child_index);
      break;
    case I256:
      this_local = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    *)basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                      ::get_child((basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   *)this,child_index);
      break;
    default:
      cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x3ba,"get_child");
    }
    return (node_ptr)(uintptr_t)this_local;
  }
  __assert_fail("type != node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x3ac,
                "node_ptr unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::get_child(node_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

[[nodiscard, gnu::pure]] constexpr node_ptr get_child(
      node_type type, std::uint8_t child_index) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->get_child(child_index);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->get_child(child_index);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->get_child(child_index);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->get_child(child_index);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }